

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1.c
# Opt level: O2

void ssh1_login_free(PacketProtocolLayer *ppl)

{
  void *ptr;
  agent_pending_query *conn;
  long lVar1;
  size_t i;
  toplevel_callback_fn_t p_Var2;
  
  if ((PacketProtocolLayer *)ppl[-6].selfptr != (PacketProtocolLayer *)0x0) {
    ssh_ppl_free((PacketProtocolLayer *)ppl[-6].selfptr);
  }
  conf_free((Conf *)ppl[-6].logctx);
  safefree(ppl[-6].seat);
  safefree(*(void **)&ppl[-5].ic_process_queue.queued);
  safefree(ppl[-5].out_pq);
  if (ppl[-4].vt != (PacketProtocolLayerVtable *)0x0) {
    strbuf_free((strbuf *)ppl[-4].vt);
  }
  safefree(ppl[-4].bpp);
  if ((prompts_t *)ppl[-4].out_pq != (prompts_t *)0x0) {
    free_prompts((prompts_t *)ppl[-4].out_pq);
  }
  if (ppl[-3].ic_process_queue.ctx != (void *)0x0) {
    lVar1 = 0;
    for (p_Var2 = (toplevel_callback_fn_t)0x0; ptr = ppl[-3].ic_process_queue.ctx,
        p_Var2 < ppl[-3].ic_process_queue.fn; p_Var2 = p_Var2 + 1) {
      freersakey((RSAKey *)((long)ptr + lVar1));
      strbuf_free(*(strbuf **)((long)ppl[-3].ic_process_queue.ctx + lVar1 + 0x48));
      lVar1 = lVar1 + 0x60;
    }
    safefree(ptr);
  }
  safefree(ppl[-4].seat);
  conn = (agent_pending_query *)ppl[-5].ic_process_queue.fn;
  if (conn != (agent_pending_query *)0x0) {
    agent_cancel_query(conn);
  }
  safefree(&ppl[-6].ic_process_queue.queued);
  return;
}

Assistant:

static void ssh1_login_free(PacketProtocolLayer *ppl)
{
    struct ssh1_login_state *s =
        container_of(ppl, struct ssh1_login_state, ppl);

    if (s->successor_layer)
        ssh_ppl_free(s->successor_layer);

    conf_free(s->conf);
    sfree(s->savedhost);
    sfree(s->rsabuf);
    sfree(s->username);
    if (s->publickey_blob)
        strbuf_free(s->publickey_blob);
    sfree(s->publickey_comment);
    if (s->cur_prompt)
        free_prompts(s->cur_prompt);
    if (s->agent_keys) {
        for (size_t i = 0; i < s->agent_keys_len; i++) {
            freersakey(&s->agent_keys[i].key);
            strbuf_free(s->agent_keys[i].comment);
        }
        sfree(s->agent_keys);
    }
    sfree(s->agent_response_to_free);
    if (s->auth_agent_query)
        agent_cancel_query(s->auth_agent_query);
    sfree(s);
}